

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O3

void __thiscall FIX::SessionID::fromString(SessionID *this,string *str)

{
  long lVar1;
  long lVar2;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  size_t local_48;
  int local_40;
  long local_38;
  
  lVar1 = std::__cxx11::string::find((char)str,0x3a);
  lVar2 = std::__cxx11::string::find((char *)str,0x2c640e,0);
  local_38 = std::__cxx11::string::rfind((char)str,0x3a);
  if (lVar2 != -1 && lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)str);
    local_98._0_8_ = &PTR__FieldBase_00323d68;
    local_98._8_4_ = 8;
    local_88._M_p = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_b8,local_b0 + (long)local_b8);
    local_68._M_p = (pointer)&local_58;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_48 = 0;
    local_40 = 0;
    local_98._0_8_ = &PTR__FieldBase_00324750;
    (this->m_beginString).super_StringField.super_FieldBase.m_tag = local_98._8_4_;
    std::__cxx11::string::_M_assign
              ((string *)&(this->m_beginString).super_StringField.super_FieldBase.m_string);
    (this->m_beginString).super_StringField.super_FieldBase.m_metrics.m_checksum = local_40;
    (this->m_beginString).super_StringField.super_FieldBase.m_metrics.m_length = local_48;
    (this->m_beginString).super_StringField.super_FieldBase.m_data._M_string_length = 0;
    *(this->m_beginString).super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
    FieldBase::~FieldBase((FieldBase *)local_98);
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)str);
    local_98._0_8_ = &PTR__FieldBase_00323d68;
    local_98._8_4_ = 0x31;
    local_88._M_p = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_b8,local_b0 + (long)local_b8);
    local_68._M_p = (pointer)&local_58;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_48 = 0;
    local_40 = 0;
    local_98._0_8_ = &PTR__FieldBase_00324108;
    (this->m_senderCompID).super_StringField.super_FieldBase.m_tag = local_98._8_4_;
    std::__cxx11::string::_M_assign
              ((string *)&(this->m_senderCompID).super_StringField.super_FieldBase.m_string);
    (this->m_senderCompID).super_StringField.super_FieldBase.m_metrics.m_checksum = local_40;
    (this->m_senderCompID).super_StringField.super_FieldBase.m_metrics.m_length = local_48;
    (this->m_senderCompID).super_StringField.super_FieldBase.m_data._M_string_length = 0;
    *(this->m_senderCompID).super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
    FieldBase::~FieldBase((FieldBase *)local_98);
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (lVar1 == local_38) {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)str);
      local_98._0_8_ = &PTR__FieldBase_00323d68;
      local_98._8_4_ = 0x38;
      local_88._M_p = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_b8,local_b0 + (long)local_b8);
      local_68._M_p = (pointer)&local_58;
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      local_48 = 0;
      local_40 = 0;
      local_98._0_8_ = &PTR__FieldBase_00324980;
      (this->m_targetCompID).super_StringField.super_FieldBase.m_tag = local_98._8_4_;
      std::__cxx11::string::_M_assign
                ((string *)&(this->m_targetCompID).super_StringField.super_FieldBase.m_string);
      (this->m_targetCompID).super_StringField.super_FieldBase.m_metrics.m_checksum = local_40;
      (this->m_targetCompID).super_StringField.super_FieldBase.m_metrics.m_length = local_48;
      (this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_string_length = 0;
      *(this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
      FieldBase::~FieldBase((FieldBase *)local_98);
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->m_sessionQualifier,0,
                 (char *)(this->m_sessionQualifier)._M_string_length,0x2b8d4e);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)str);
      local_98._0_8_ = &PTR__FieldBase_00323d68;
      local_98._8_4_ = 0x38;
      local_88._M_p = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_b8,local_b0 + (long)local_b8);
      local_68._M_p = (pointer)&local_58;
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      local_48 = 0;
      local_40 = 0;
      local_98._0_8_ = &PTR__FieldBase_00324980;
      (this->m_targetCompID).super_StringField.super_FieldBase.m_tag = local_98._8_4_;
      std::__cxx11::string::_M_assign
                ((string *)&(this->m_targetCompID).super_StringField.super_FieldBase.m_string);
      (this->m_targetCompID).super_StringField.super_FieldBase.m_metrics.m_checksum = local_40;
      (this->m_targetCompID).super_StringField.super_FieldBase.m_metrics.m_length = local_48;
      (this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_string_length = 0;
      *(this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
      FieldBase::~FieldBase((FieldBase *)local_98);
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      std::__cxx11::string::substr((ulong)local_98,(ulong)str);
      std::__cxx11::string::operator=((string *)&this->m_sessionQualifier,(string *)local_98);
      if ((string *)local_98._0_8_ != (string *)&local_88) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_p + 1));
      }
    }
    toString(this,&this->m_frozenString);
  }
  return;
}

Assistant:

void fromString( const std::string& str )
  {
    std::string::size_type first =
      str.find_first_of(':');
    std::string::size_type second =
      str.find("->");
    std::string::size_type third =
      str.find_last_of(':');
    if( first == std::string::npos )
      return;
    if( second == std::string::npos )
      return;
    m_beginString = str.substr(0, first);
    m_senderCompID = str.substr(first+1, second - first - 1);
    if( first == third )
    {
      m_targetCompID = str.substr(second+2);
      m_sessionQualifier = "";
    }
    else
    {
      m_targetCompID = str.substr(second+2, third - second - 2);
      m_sessionQualifier = str.substr(third+1);
    }
    toString(m_frozenString);
  }